

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int * __thiscall
JsUtil::
BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  Allocator *this_00;
  Memory *this_01;
  DictAllocator *allocator;
  int *piVar1;
  offset_in_DictAllocator_to_subr AllocFunc;
  TrackAllocData local_40;
  uint local_14;
  BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
  *pBStack_10;
  uint bucketCount_local;
  BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
  *this_local;
  
  this_00 = &this->alloc->super_Allocator;
  local_14 = bucketCount;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&int::typeinfo,0,(ulong)bucketCount,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
             ,0x447);
  this_01 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(this_00,&local_40);
  allocator = (DictAllocator *)
              Memory::
              TypeAllocatorFunc<Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_int>
              ::GetAllocFunc();
  piVar1 = Memory::
           AllocateArray<Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator,int,false>
                     (this_01,allocator,AllocFunc,(ulong)local_14);
  return piVar1;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }